

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O0

bool __thiscall QSslContext::cacheSession(QSslContext *this,SSL *ssl)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *pQVar4;
  SSL_SESSION *pSVar5;
  ulong uVar6;
  unsigned_long uVar7;
  char *in_RDI;
  long in_FS_OFFSET;
  int sessionSize;
  uchar *data;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  bool local_41;
  char local_40 [32];
  char *local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) != 0) {
    in_stack_ffffffffffffff90 = *(QLoggingCategoryMacroHolder<(QtMsgType)1> **)(in_RDI + 0x10);
    pQVar4 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
             q_SSL_get_session((SSL *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88))
    ;
    if (in_stack_ffffffffffffff90 == pQVar4) {
      local_41 = true;
      goto LAB_0015fbcc;
    }
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    q_SSL_SESSION_free((SSL_SESSION *)0x15fa8a);
  }
  pSVar5 = q_SSL_get1_session((SSL *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  *(SSL_SESSION **)(in_RDI + 0x10) = pSVar5;
  if (((*(long *)(in_RDI + 0x10) != 0) &&
      (uVar6 = QSslConfiguration::testSslOption
                         ((int)in_RDI +
                          (SslOptionDisableSessionPersistence|SslOptionDisableLegacyRenegotiation)),
      (uVar6 & 1) == 0)) &&
     (iVar2 = q_i2d_SSL_SESSION((SSL_SESSION *)
                                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                                (uchar **)0x15fad8), 0 < iVar2)) {
    QByteArray::resize((longlong)(in_RDI + 0x18));
    local_20 = QByteArray::data((QByteArray *)in_stack_ffffffffffffff90);
    iVar3 = q_i2d_SSL_SESSION((SSL_SESSION *)
                              CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                              (uchar **)0x15fb23);
    if (iVar3 == 0) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      lcTlsBackend();
      anon_unknown.dwarf_142f1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_stack_ffffffffffffff90,
                 (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_142f1d::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x15fb6c);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),in_RDI,
                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                   (char *)0x15fb82);
        QMessageLogger::warning(local_40,"could not store persistent version of SSL session");
        local_10 = local_10 & 0xffffffffffffff00;
      }
    }
    uVar7 = q_SSL_SESSION_get_ticket_lifetime_hint
                      ((SSL_SESSION *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88))
    ;
    *(int *)(in_RDI + 0x30) = (int)uVar7;
  }
  local_41 = *(long *)(in_RDI + 0x10) != 0;
LAB_0015fbcc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QSslContext::cacheSession(SSL* ssl)
{
    // don't cache the same session again
    if (session && session == q_SSL_get_session(ssl))
        return true;

    // decrease refcount of currently stored session
    // (this might happen if there are several concurrent handshakes in flight)
    if (session)
        q_SSL_SESSION_free(session);

    // cache the session the caller gave us and increase reference count
    session = q_SSL_get1_session(ssl);

    if (session && !sslConfiguration.testSslOption(QSsl::SslOptionDisableSessionPersistence)) {
        int sessionSize = q_i2d_SSL_SESSION(session, nullptr);
        if (sessionSize > 0) {
            m_sessionASN1.resize(sessionSize);
            unsigned char *data = reinterpret_cast<unsigned char *>(m_sessionASN1.data());
            if (!q_i2d_SSL_SESSION(session, &data))
                qCWarning(lcTlsBackend, "could not store persistent version of SSL session");
            m_sessionTicketLifeTimeHint = q_SSL_SESSION_get_ticket_lifetime_hint(session);
        }
    }

    return (session != nullptr);
}